

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleMake
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,TupleMake *curr)

{
  bool bVar1;
  Expression **childp;
  Expression **expr;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  TupleMake *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                 (&(curr->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  _expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                    (&(curr->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end2.index,(Iterator *)&expr);
    if (!bVar1) break;
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
             operator*((Iterator *)&__end2.index);
    noteAny(this,childp);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    for (auto& expr : curr->operands) {
      noteAny(&expr);
    }
  }